

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall
md::Code::lsx(Code *this,uint8_t bitcount,DataRegister *reg,bool direction_left,Size size)

{
  int iVar1;
  exception *this_00;
  short local_2a;
  uint16_t opcode;
  uint16_t direction_mask;
  uint16_t size_code;
  Size size_local;
  bool direction_left_local;
  DataRegister *reg_local;
  uint8_t bitcount_local;
  Code *this_local;
  
  if ((bitcount < 9) && (bitcount != '\0')) {
    reg_local._7_1_ = bitcount;
    if (bitcount == '\b') {
      reg_local._7_1_ = 0;
    }
    local_2a = 0;
    if (size == WORD) {
      local_2a = 1;
    }
    else if (size == LONG) {
      local_2a = 2;
    }
    iVar1 = (**(reg->super_Register).super_Param._vptr_Param)();
    add_opcode(this,(ushort)reg_local._7_1_ * 0x200 + -0x1ff8 + (ushort)direction_left * 0x100 +
                    local_2a * 0x40 + (short)iVar1);
    return this;
  }
  this_00 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_00);
  __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

Code& Code::lsx(uint8_t bitcount, const DataRegister& reg, bool direction_left, md::Size size)
{
    if(bitcount > 8 || bitcount == 0)
        throw std::exception(); // Impossible

    if(bitcount == 8)
        bitcount = 0;

    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t direction_mask = (direction_left) ? 1 : 0;

    uint16_t opcode = 0xE008 + (bitcount << 9) + (direction_mask << 8) + (size_code << 6) + reg.getXn();
    this->add_opcode(opcode);
    return *this;
}